

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O2

void srot(int n,float *x,int incx,float *y,int incy,float c,float s)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  bool bVar6;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
        fVar1 = x[uVar4];
        fVar2 = y[uVar4];
        y[uVar4] = fVar2 * c - fVar1 * s;
        x[uVar4] = c * fVar1 + fVar2 * s;
      }
    }
    else {
      pfVar3 = y + (incy >> 0x1f & (1 - n) * incy);
      pfVar5 = x + (incx >> 0x1f & (1 - n) * incx);
      while (bVar6 = n != 0, n = n + -1, bVar6) {
        fVar1 = *pfVar5;
        fVar2 = *pfVar3;
        *pfVar3 = fVar2 * c - fVar1 * s;
        *pfVar5 = c * fVar1 + fVar2 * s;
        pfVar3 = pfVar3 + incy;
        pfVar5 = pfVar5 + incx;
      }
    }
  }
  return;
}

Assistant:

void srot ( int n, float x[], int incx, float y[], int incy, float c, float s )

//****************************************************************************80
//
//  Purpose:
//
//    SROT applies a float plane rotation.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, float X[*], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of Y.
//
//    Input, float C, S, parameters (presumably the cosine and
//    sine of some angle) that define a plane rotation.
//
{
  int i;
  int ix;
  int iy;
  float stemp;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      stemp = c * x[i] + s * y[i];
      y[i]  = c * y[i] - s * x[i];
      x[i]  = stemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      stemp = c * x[ix] + s * y[iy];
      y[iy] = c * y[iy] - s * x[ix];
      x[ix] = stemp;
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}